

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryCache.cpp
# Opt level: O1

char * BinaryCache::GetBytecode(char *path)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  bool bVar8;
  
  uVar3 = NULLC::GetStringHash(path);
  if (uVar3 == lastHash) {
    puVar4 = &lastBytecode;
  }
  else {
    bVar8 = DAT_0022d27c != 0;
    uVar6 = 0;
    if ((bVar8) && (uVar6 = 0, uVar3 != *(uint *)(cache + 8))) {
      puVar7 = (uint *)(cache + 0x30);
      uVar2 = 1;
      do {
        uVar5 = uVar2;
        uVar6 = DAT_0022d27c;
        if (DAT_0022d27c == uVar5) break;
        uVar1 = *puVar7;
        puVar7 = puVar7 + 10;
        uVar2 = uVar5 + 1;
        uVar6 = uVar5;
      } while (uVar3 != uVar1);
      bVar8 = uVar5 < DAT_0022d27c;
    }
    if (uVar6 == DAT_0022d27c) {
      return (char *)0x0;
    }
    if (!bVar8) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x7f,
                    "T &FastVector<BinaryCache::CodeDescriptor>::operator[](unsigned int) [T = BinaryCache::CodeDescriptor, zeroNewMemory = false, skipConstructor = false]"
                   );
    }
    puVar4 = (undefined8 *)(cache + (ulong)uVar6 * 0x28 + 0x10);
  }
  return (char *)*puVar4;
}

Assistant:

const char* BinaryCache::GetBytecode(const char* path)
{
	unsigned int hash = NULLC::GetStringHash(path);
	if(hash == lastHash)
		return lastBytecode;

	unsigned int i = 0;
	for(; i < cache.size(); i++)
	{
		if(hash == cache[i].nameHash)
			break;
	}
	if(i != cache.size())
		return cache[i].binary;

	return NULL;
}